

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp:235:46)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_regexp_object_cpp:235:46)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value_type vVar1;
  value *v;
  pointer pvVar2;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_00;
  gc_heap_ptr_untyped local_38;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  args_00 = args;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish != v) {
    anon_unknown_35::cast_to_regexp((anon_unknown_35 *)&local_38,v);
    if (local_38.heap_ != (gc_heap *)0x0) {
      pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      args_00 = (vector<mjs::value,_std::allocator<mjs::value>_> *)
                ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pvVar2);
      if (args_00 == (vector<mjs::value,_std::allocator<mjs::value>_> *)0x28) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
      }
      else {
        vVar1 = pvVar2[1].type_;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
        if (vVar1 != undefined) goto LAB_001560b7;
      }
      value::value(__return_storage_ptr__,
                   (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  }
LAB_001560b7:
  make_regexp_object::anon_class_16_1_570cf4e1::operator()
            (__return_storage_ptr__,&(this->f).construct_regexp,(value *)args,args_00);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }